

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool __thiscall dg::vr::RelationsAnalyzer::mayOverwrite(RelationsAnalyzer *this,I inst,V address)

{
  bool bVar1;
  ValueRelations *graph_00;
  VRCodeGraph *in_RDI;
  ValueRelations *unaff_retaddr;
  RelationsAnalyzer *in_stack_00000008;
  V memoryPtr;
  StoreInst *store;
  ValueRelations *graph;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  byte bVar2;
  I in_stack_ffffffffffffffc8;
  VRCodeGraph *from;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  from = in_RDI;
  VRCodeGraph::getVRLocation
            (in_RDI,(Instruction *)
                    CONCAT17(in_stack_ffffffffffffffbf,
                             CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
  bVar1 = isSafe((RelationsAnalyzer *)address,(I)graph);
  if (bVar1) {
    return false;
  }
  bVar1 = isDangerous(in_stack_ffffffffffffffc8);
  if (bVar1) {
    return true;
  }
  llvm::cast<llvm::StoreInst,llvm::Instruction_const>((Instruction *)0x1cd5b7);
  graph_00 = (ValueRelations *)llvm::StoreInst::getPointerOperand((StoreInst *)0x1cd5c6);
  bVar1 = sameBase(graph_00,(V)in_RDI,
                   (V)CONCAT17(in_stack_ffffffffffffffbf,
                               CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
  bVar2 = 1;
  if (!bVar1) {
    bVar1 = hasKnownOrigin((ValueRelations *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(V)from);
    if (!bVar1) {
      bVar1 = mayHaveAlias(in_stack_00000008,unaff_retaddr,
                           (V)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      bVar2 = 1;
      if (bVar1) goto LAB_001cd660;
    }
    bVar1 = mayHaveAlias(in_stack_00000008,unaff_retaddr,
                         (V)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    bVar2 = 0;
    if (bVar1) {
      bVar1 = hasKnownOrigin((ValueRelations *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(V)from);
      bVar2 = bVar1 ^ 0xff;
    }
  }
LAB_001cd660:
  return (bool)(bVar2 & 1);
}

Assistant:

bool RelationsAnalyzer::mayOverwrite(I inst, V address) const {
    assert(inst);
    assert(address);

    const ValueRelations &graph = codeGraph.getVRLocation(inst).relations;

    if (isSafe(inst))
        return false;

    if (isDangerous(inst))
        return true;

    const auto *store = llvm::cast<llvm::StoreInst>(inst);
    V memoryPtr = store->getPointerOperand();

    return sameBase(graph, memoryPtr, address) ||
           (!hasKnownOrigin(graph, memoryPtr) &&
            mayHaveAlias(graph, address)) ||
           (mayHaveAlias(graph, memoryPtr) && !hasKnownOrigin(graph, address));
}